

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O3

int witness_stack_from_bytes(uchar *bytes,wally_tx_witness_stack **witness,uint64_t *offset)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  uchar *bytes_00;
  uint64_t witness_len;
  uint64_t num_witnesses;
  size_t local_40;
  size_t local_38;
  
  sVar2 = varint_from_bytes(bytes,&local_38);
  bytes_00 = bytes + sVar2;
  if (local_38 != 0) {
    iVar1 = wally_tx_witness_stack_init_alloc(local_38,witness);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_38 != 0) {
      sVar2 = 0;
      do {
        sVar3 = varint_from_bytes(bytes_00,&local_40);
        iVar1 = wally_tx_witness_stack_set(*witness,sVar2,bytes_00 + sVar3,local_40);
        if (iVar1 != 0) {
          return iVar1;
        }
        bytes_00 = bytes_00 + sVar3 + local_40;
        sVar2 = sVar2 + 1;
      } while (sVar2 < local_38);
    }
  }
  *offset = (long)bytes_00 - (long)bytes;
  return 0;
}

Assistant:

static int witness_stack_from_bytes(const unsigned char *bytes, struct wally_tx_witness_stack **witness, uint64_t *offset)
{
    int ret = WALLY_OK;
    size_t i;
    uint64_t num_witnesses;
    const unsigned char *p = bytes;
    p += varint_from_bytes(p, &num_witnesses);
    if (num_witnesses) {
        ret = wally_tx_witness_stack_init_alloc(num_witnesses, witness);
        if (ret != WALLY_OK)
            goto cleanup;

        for (i = 0; i < num_witnesses; ++i) {
            uint64_t witness_len;
            p += varint_from_bytes(p, &witness_len);
            ret = wally_tx_witness_stack_set(*witness, i, p, witness_len);
            if (ret != WALLY_OK)
                goto cleanup;
            p += witness_len;
        }
    }

    *offset = p - bytes;

cleanup:
    return ret;
}